

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlen.c
# Opt level: O1

int vflen(char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  uint uVar2;
  byte *in_RAX;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  double *pdVar11;
  long lVar12;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  byte *pbVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  char *endp;
  byte *local_38;
  
  iVar13 = 0;
  local_38 = in_RAX;
LAB_001327ef:
  if (*fmt == 0x25) {
    do {
      pbVar14 = (byte *)fmt + 1;
      bVar1 = *pbVar14;
      if (bVar1 < 0x2b) {
        if (bVar1 == 0x20) goto LAB_00132832;
        iVar8 = 2;
        if (bVar1 != 0x23) goto LAB_0013283e;
      }
      else {
        if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_0013283e;
LAB_00132832:
        iVar8 = 1;
      }
      iVar13 = iVar13 + iVar8;
      fmt = (char *)pbVar14;
    } while( true );
  }
  iVar13 = iVar13 + 1;
  if (*fmt == 0) {
    return iVar13;
  }
  goto switchD_00132956_caseD_62;
LAB_0013283e:
  uVar3 = strtol((char *)pbVar14,(char **)&local_38,10);
  pbVar16 = local_38;
  if (pbVar14 == local_38) {
    if (*pbVar14 == 0x2a) {
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar5 = (int *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        piVar5 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar5 + 2;
      }
      uVar3 = (ulong)*piVar5;
      pbVar16 = (byte *)fmt + 2;
    }
    else {
      uVar3 = 0;
      pbVar16 = pbVar14;
    }
  }
  if (*pbVar16 == 0x2e) {
    pbVar14 = pbVar16 + 1;
    uVar4 = strtol((char *)pbVar14,(char **)&local_38,10);
    fmt = (char *)local_38;
    if ((local_38 == pbVar14) && (fmt = (char *)pbVar14, *pbVar14 == 0x2a)) {
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar5 = (int *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        piVar5 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar5 + 2;
      }
      uVar4 = (ulong)*piVar5;
      fmt = (char *)(pbVar16 + 2);
    }
    uVar6 = uVar4;
    if ((long)uVar4 < (long)uVar3) {
      uVar6 = uVar3;
    }
  }
  else {
    uVar4 = 0;
    uVar6 = uVar3;
    fmt = (char *)pbVar16;
  }
  if (*fmt == 0x68) {
    fmt = (char *)((byte *)fmt + 1);
  }
  else if (*fmt == 0x6c) {
    if (((byte *)fmt)[1] == 0x6c) {
      fmt = (char *)((byte *)fmt + 2);
    }
    else {
      fmt = (char *)((byte *)fmt + 1);
    }
  }
  bVar1 = *fmt;
  if (0x57 < bVar1) {
    switch(bVar1) {
    case 0x62:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      break;
    case 99:
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar5 = (int *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        piVar5 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar5 + 2;
      }
      iVar8 = *piVar5;
      sVar7 = 1;
      if (0x7f < iVar8) {
        sVar7 = __ctype_get_mb_cur_max();
      }
      uVar6 = 1;
      if (sVar7 < uVar3) {
        uVar6 = uVar3;
      }
      iVar9 = (int)uVar6;
      if ((0x7f < iVar8) && (uVar3 <= sVar7)) {
        sVar7 = __ctype_get_mb_cur_max();
        iVar9 = (int)sVar7;
      }
      iVar13 = iVar13 + iVar9;
      break;
    case 0x65:
    case 0x67:
      goto switchD_00132956_caseD_65;
    case 0x66:
      uVar2 = ap->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        pdVar11 = (double *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->fp_offset = uVar2 + 0x10;
      }
      else {
        pdVar11 = (double *)ap->overflow_arg_area;
        ap->overflow_arg_area = pdVar11 + 1;
      }
      dVar19 = *pdVar11;
      if (dVar19 <= -dVar19) {
        dVar19 = -dVar19;
      }
      lVar12 = 0xf;
      if (1000000.0 < dVar19) {
        lVar12 = 0x13d;
      }
      lVar15 = uVar3 + 2;
      if ((long)(uVar3 + 2) < lVar12) {
        lVar15 = lVar12;
      }
      iVar8 = (int)lVar15;
      iVar9 = (int)uVar4 + -6;
      if (uVar4 == 0) {
        iVar9 = 0;
      }
      iVar13 = iVar13 + iVar9;
LAB_00132b18:
      iVar13 = iVar13 + iVar8;
      break;
    case 0x70:
      if (ap->gp_offset < 0x29) {
        ap->gp_offset = ap->gp_offset + 8;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      bVar18 = SBORROW8(uVar6,0x15);
      bVar17 = (long)(uVar6 - 0x15) < 0;
      uVar3 = 0x14;
      goto LAB_001329b1;
    case 0x73:
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar10 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        puVar10 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar10 + 1;
      }
      if (uVar4 == 0) {
        sVar7 = strlen((char *)*puVar10);
        if ((long)uVar6 <= (long)(int)sVar7) {
          uVar6 = (long)(int)sVar7;
        }
      }
      goto LAB_001329b5;
    default:
      if (bVar1 != 0x58) break;
    case 0x61:
    case 100:
    case 0x69:
    case 0x75:
    case 0x78:
      if (ap->gp_offset < 0x29) {
        ap->gp_offset = ap->gp_offset + 8;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
      bVar18 = SBORROW8(uVar6,0x18);
      bVar17 = (long)(uVar6 - 0x18) < 0;
      uVar3 = 0x17;
LAB_001329b1:
      if (bVar18 != bVar17) {
        uVar6 = uVar3;
      }
LAB_001329b5:
      iVar13 = iVar13 + (int)uVar6;
    }
switchD_00132956_caseD_62:
    fmt = (char *)((byte *)fmt + 1);
    goto LAB_001327ef;
  }
  if (bVar1 == 0x25) {
    if ((long)uVar3 < 2) {
      uVar3 = 1;
    }
    iVar8 = (int)uVar3;
    goto LAB_00132b18;
  }
  if ((bVar1 != 0x45) && (bVar1 != 0x47)) goto switchD_00132956_caseD_62;
switchD_00132956_caseD_65:
  if (ap->fp_offset < 0xa1) {
    ap->fp_offset = ap->fp_offset + 0x10;
  }
  else {
    ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
  }
  bVar18 = SBORROW8(uVar6,0xe);
  bVar17 = (long)(uVar6 - 0xe) < 0;
  uVar3 = 0xd;
  goto LAB_001329b1;
}

Assistant:

int vflen(char *fmt, va_list ap)
{
    int len = 0;
    char *cp, c;
    long long l;
    int i;
    double d; 

    /*
     * This code modifies 'ap', but we do not know if va_list is a structure
     * or a pointer to an array so we do not know if it is a local variable
     * or not.
     * C99 gets around this by defining va_copy() to make copies of ap, but
     * this does not exist on all systems.
     * For now, I just assume that when va_list is a pointer the system also
     * provides a va_copy macro to work around this problem. The only system
     * I have seen needing this so far was Linux on AMD64.
     */
#if defined(HAVE_VA_COPY)
    va_list ap_local;
    va_copy(ap_local, ap);
#    define ap ap_local
#endif

    for(cp = fmt; *cp; cp++) {
	switch(*cp) {

	/* A format specifier */
	case '%': {
	    char *endp;
	    long conv_len1=0, conv_len2=0, conv_len=0;
	    signed int arg_size;

	    /* Firstly, strip the modifier flags (+-#0 and [space]) */
	    for(; (c=*++cp);) {
		if ('#' == c)
		    len+=2; /* Worst case of "0x" */
		else if ('-' == c || '+' == c || ' ' == c)
		    len++;
		else
		    break;
	    }

	    /* Width specifier */
	    l = strtol(cp, &endp, 10);
	    if (endp != cp) {
		cp = endp;
		conv_len = conv_len1 = l;
	    } else if (*cp == '*') {
		conv_len = conv_len1 = (int)va_arg(ap, int);
		cp++;
	    }

	    /* Precision specifier */
	    if ('.' == *cp) {
		cp++;
		conv_len2 = strtol(cp, &endp, 10);
		if (endp != cp) {
		    cp = endp;
		} else if (*cp == '*') {
		    conv_len2 = (int)va_arg(ap, int);
		    cp++;
		}
		conv_len = MAX(conv_len1, conv_len2);
	    }

	    /* Short/long identifier */
	    if ('h' == *cp) {
		arg_size = -1; /* short */
		cp++;
	    } else if ('l' == *cp) {
		arg_size = 1; /* long */
		cp++;
		if ('l' == *cp) {
		    arg_size = 2; /* long long */
		    cp++;
		}
	    } else {
		arg_size = 0; /* int */
	    }

	    /* The actual type */
	    switch (*cp) {
	    case '%':
		/*
		 * Not real ANSI I suspect, but we'll allow for the
		 * completely daft "%10%" example.
		 */
		len += MAX(conv_len1, 1);
		break;

	    case 'd':
	    case 'i':
	    case 'u':
	    case 'a':
	    case 'x':
	    case 'X':
		/* Remember: char and short are sent as int on the stack */
		if (arg_size == -1)
		    l = (long)va_arg(ap, int);
		else if (arg_size == 1)
		    l = va_arg(ap, long); 
		else if (arg_size == 2)
		    l = va_arg(ap, long long); 
		else 
		    l = (long)va_arg(ap, int);

		DEBUG_printf("%d", l);

		/*
		 * No number can be more than 24 characters so we'll take
		 * the max of conv_len and 24 (23 is len(2^64) in octal).
		 * All that work above and we then go and estimate ;-),
		 * but it's needed incase someone does %500d.
		 */
		len += MAX(conv_len, 23);
		break;

	    case 'c':
		i = va_arg(ap, int);
		DEBUG_printf("%c", i);
		/*
		 * Note that %10c and %.10c act differently.
		 * Besides, I think precision is not really allowed for %c.
		 */
		len += MAX(conv_len1, i>=0x80 ?MB_CUR_MAX :1);
		break;

	    case 'f':
		d = va_arg(ap, double);
		DEBUG_printf("%f", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that.
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double. The worst case I can
		 * think of is 317 characters (-1[308 zeros].000000)
		 * without using precision codes. That's horrid. I
		 * cheat and either use 317 or 15 depending on how
		 * large the number is as I reckon 99% of floats
		 * aren't that long.
		 */
		l = (ABS(d) > 1000000) ? 317 : 15;
		l = MAX(l, conv_len1 + 2);
		if (conv_len2) l += conv_len2 - 6;
		len += l;
		break;

	    case 'e':
	    case 'E':
	    case 'g':
	    case 'G':
		d = va_arg(ap, double);
		DEBUG_printf("%g", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double (which defaults to only
		 * '-' + 6 + '.' + 'E[+-]xxx' == 13.
		 */
		len += MAX(conv_len, 13);
		break;

	    case 'p':
		l = (long)va_arg(ap, void *);
		/*
		 * Max pointer is 64bits == 16 chars (on alpha),
		 * == 20 with + "0x".
		 */
		DEBUG_printf("%p", (void *)l);
		len += MAX(conv_len, 20);
		break;

	    case 'n':
		/* produces no output */
		break;

	    case 's': {
		char *s = (char *)va_arg(ap, char *);
		DEBUG_printf("%s", s);

		if (!conv_len2) {
		    len += MAX(conv_len, (int)strlen(s));
		} else {
		    len += conv_len;
		}
		break;
	    }

	    default:
		/* wchar_t types of 'C' and 'S' aren't supported */
		DEBUG_printf("Arg is %c\n", *cp);
	    }
	    
	}

	case '\0':
	    break;

	default:
	    DEBUG_printf("%c", *cp);
	    len++;
	}
    }

    va_end(ap);

    return len+1; /* one for the null character */
}